

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phong.cpp
# Opt level: O3

RGBColor __thiscall pm::Phong::pathShade(Phong *this,ShadeRecord *sr)

{
  float fVar1;
  World *pWVar2;
  long in_RDX;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  RGBColor RVar13;
  Vector3 sp;
  undefined1 local_48 [8];
  float local_40;
  undefined1 local_38 [24];
  
  fVar1 = *(float *)(in_RDX + 0x30);
  fVar8 = (float)*(undefined8 *)(in_RDX + 0x28);
  fVar9 = (float)((ulong)*(undefined8 *)(in_RDX + 0x28) >> 0x20);
  fVar10 = fVar1 - fVar9 * 0.0071;
  fVar11 = fVar8 * 0.0071 + fVar1 * -0.0034;
  fVar12 = fVar9 * 0.0034 - fVar8;
  fVar4 = SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11);
  fVar10 = fVar10 / fVar4;
  fVar11 = fVar11 / fVar4;
  fVar12 = fVar12 / fVar4;
  SamplerState::sampleHemisphere((SamplerState *)local_38);
  fVar4 = (float)local_38._0_8_;
  fVar7 = SUB84(local_38._0_8_,4);
  auVar3._0_4_ = (float)local_38._8_4_ * fVar8 +
                 (fVar11 * fVar1 - fVar9 * fVar12) * fVar4 + fVar10 * fVar7;
  auVar3._4_4_ = (float)local_38._8_4_ * fVar9 +
                 fVar11 * fVar7 + (fVar12 * fVar8 - fVar1 * fVar10) * fVar4;
  auVar3._8_4_ = (float)local_38._8_4_ * 0.0 + 0.0;
  auVar3._12_4_ = (float)local_38._8_4_ * 0.0 + 0.0;
  local_38._20_4_ =
       fVar1 * (float)local_38._8_4_ + fVar12 * fVar7 + (fVar10 * fVar9 - fVar8 * fVar11) * fVar4;
  auVar5._0_4_ = SQRT((float)local_38._20_4_ * (float)local_38._20_4_ +
                      auVar3._0_4_ * auVar3._0_4_ + auVar3._4_4_ * auVar3._4_4_);
  local_38._20_4_ = (float)local_38._20_4_ / auVar5._0_4_;
  auVar5._4_4_ = auVar5._0_4_;
  auVar5._8_4_ = auVar5._0_4_;
  auVar5._12_4_ = auVar5._0_4_;
  auVar3 = divps(auVar3,auVar5);
  local_38._12_8_ = auVar3._0_8_;
  fVar8 = *(float *)(in_RDX + 0x30) * (float)local_38._20_4_ +
          *(float *)(in_RDX + 0x28) * auVar3._0_4_ + auVar3._4_4_ * *(float *)(in_RDX + 0x2c);
  fVar7 = fVar8 * 0.31830987;
  fVar1 = *(float *)((long)&sr->tracer + 4);
  fVar4 = *(float *)&sr->tracer;
  local_38._0_8_ = *(unsigned_long *)(in_RDX + 0x10);
  local_38._8_4_ = *(int *)(in_RDX + 0x18);
  pWVar2 = sr->world;
  fVar9 = SUB84(pWVar2,0);
  (**(code **)(**(long **)(in_RDX + 0x68) + 0x18))
            (local_48,*(long **)(in_RDX + 0x68),*(undefined8 *)(in_RDX + 0x60),local_38,
             *(int *)(in_RDX + 0x4c) + 1);
  auVar6._0_4_ = fVar8 * local_48._0_4_ * fVar9 * (float)((ulong)pWVar2 >> 0x20) * 0.31830987;
  auVar6._4_4_ = fVar8 * local_48._4_4_ * fVar4 * fVar9 * 0.31830987;
  auVar6._8_8_ = 0;
  auVar3 = divps(auVar6,CONCAT88(0,CONCAT44(fVar7,fVar7)));
  (this->super_Material)._vptr_Material = auVar3._0_8_;
  (this->super_Material).type_ = (Type)((fVar1 * fVar9 * 0.31830987 * local_40 * fVar8) / fVar7);
  RVar13.b = auVar3._0_4_;
  RVar13.r = fVar7;
  RVar13.g = fVar7;
  return RVar13;
}

Assistant:

RGBColor Phong::pathShade(ShadeRecord &sr) const
{
	Vector3 wi;
	const Vector3 wo = -sr.ray.d;
	float pdf = 0.0f;
	const RGBColor f = diffuseBrdf_.sampleF(sr, wo, wi, pdf);
	const float nDotWi = dot(sr.normal, wi);
	const Ray reflectedRay(sr.hitPoint, wi);

	return (f * sr.tracer.traceRay(sr.world, reflectedRay, sr.depth + 1) * nDotWi / pdf);
}